

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O0

rnndelem * trydelem(rnndb *db,char *file,xmlNode *node)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  uint64_t uVar4;
  rnndelem *prVar5;
  rnndelem **pprVar6;
  rnnetype rVar7;
  char *in_RDX;
  rnndb *in_RSI;
  long in_RDI;
  xmlNode *chain;
  char *str;
  xmlAttr *attr;
  rnndelem *res;
  int width;
  rnndelem *delem;
  xmlNode *chain_1;
  xmlAttr *attr_2;
  rnndelem *res_2;
  xmlAttr *attr_1;
  rnndelem *res_1;
  rnntypeinfo *in_stack_ffffffffffffff88;
  _xmlNode *p_Var8;
  rnntypeinfo *in_stack_ffffffffffffff90;
  rnndb *in_stack_ffffffffffffff98;
  rnndb *db_00;
  char *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  rnndb *in_stack_ffffffffffffffb0;
  long local_48;
  long local_40;
  long local_30;
  xmlNode *in_stack_ffffffffffffffd8;
  rnndelem *local_8;
  
  iVar1 = strcmp(*(char **)(in_RDX + 0x10),"use-group");
  if (iVar1 == 0) {
    local_8 = (rnndelem *)calloc(0x108,1);
    local_8->file = (char *)in_RSI;
    local_8->type = RNN_ETYPE_USE_GROUP;
    for (local_30 = *(long *)(in_RDX + 0x58); local_30 != 0; local_30 = *(long *)(local_30 + 0x30))
    {
      iVar1 = strcmp(*(char **)(local_30 + 0x10),"name");
      if (iVar1 == 0) {
        pcVar3 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa0,(int)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                           ,(xmlAttr *)in_stack_ffffffffffffff90);
        pcVar3 = strdup(pcVar3);
        local_8->name = pcVar3;
      }
      else {
        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",in_RSI,
                (ulong)*(ushort *)(in_RDX + 0x70),*(undefined8 *)(local_30 + 0x10),
                *(undefined8 *)(in_RDX + 0x10));
        *(undefined4 *)(in_RDI + 0x80) = 1;
      }
    }
    if (local_8->name == (char *)0x0) {
      fprintf(_stderr,"%s:%d: nameless use-group\n",in_RSI,(ulong)*(ushort *)(in_RDX + 0x70));
      *(undefined4 *)(in_RDI + 0x80) = 1;
      local_8 = (rnndelem *)0x0;
    }
  }
  else {
    iVar1 = strcmp(*(char **)(in_RDX + 0x10),"stripe");
    if ((iVar1 == 0) || (iVar1 = strcmp(*(char **)(in_RDX + 0x10),"array"), iVar1 == 0)) {
      local_8 = (rnndelem *)calloc(0x108,1);
      iVar1 = strcmp(*(char **)(in_RDX + 0x10),"stripe");
      rVar7 = RNN_ETYPE_STRIPE;
      if (iVar1 != 0) {
        rVar7 = RNN_ETYPE_ARRAY;
      }
      local_8->type = rVar7;
      local_8->length = 1;
      local_8->file = (char *)in_RSI;
      for (local_40 = *(long *)(in_RDX + 0x58); local_40 != 0; local_40 = *(long *)(local_40 + 0x30)
          ) {
        iVar1 = strcmp(*(char **)(local_40 + 0x10),"name");
        if (iVar1 == 0) {
          pcVar3 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             in_stack_ffffffffffffffa0,
                             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                             (xmlAttr *)in_stack_ffffffffffffff90);
          pcVar3 = strdup(pcVar3);
          local_8->name = pcVar3;
        }
        else {
          iVar1 = strcmp(*(char **)(local_40 + 0x10),"offset");
          if (iVar1 == 0) {
            uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffac,
                                                  in_stack_ffffffffffffffa8),
                                 (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                 (xmlAttr *)in_stack_ffffffffffffff98);
            local_8->offset = uVar4;
          }
          else {
            iVar1 = strcmp(*(char **)(local_40 + 0x10),"length");
            if (iVar1 == 0) {
              uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                   (char *)CONCAT44(in_stack_ffffffffffffffac,
                                                    in_stack_ffffffffffffffa8),
                                   (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                   (xmlAttr *)in_stack_ffffffffffffff98);
              local_8->length = uVar4;
            }
            else {
              iVar1 = strcmp(*(char **)(local_40 + 0x10),"stride");
              if (iVar1 == 0) {
                uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                     (char *)CONCAT44(in_stack_ffffffffffffffac,
                                                      in_stack_ffffffffffffffa8),
                                     (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                                     (xmlAttr *)in_stack_ffffffffffffff98);
                local_8->stride = uVar4;
              }
              else {
                iVar1 = strcmp(*(char **)(local_40 + 0x10),"prefix");
                if (iVar1 == 0) {
                  pcVar3 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                       in_stack_ffffffffffffffa8),
                                     in_stack_ffffffffffffffa0,
                                     (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     (xmlAttr *)in_stack_ffffffffffffff90);
                  pcVar3 = strdup(pcVar3);
                  (local_8->varinfo).prefixstr = pcVar3;
                }
                else {
                  iVar1 = strcmp(*(char **)(local_40 + 0x10),"varset");
                  if (iVar1 == 0) {
                    pcVar3 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                         in_stack_ffffffffffffffa8),
                                       in_stack_ffffffffffffffa0,
                                       (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                       (xmlAttr *)in_stack_ffffffffffffff90);
                    pcVar3 = strdup(pcVar3);
                    (local_8->varinfo).varsetstr = pcVar3;
                  }
                  else {
                    iVar1 = strcmp(*(char **)(local_40 + 0x10),"variants");
                    if (iVar1 == 0) {
                      pcVar3 = getattrib((rnndb *)CONCAT44(in_stack_ffffffffffffffac,
                                                           in_stack_ffffffffffffffa8),
                                         in_stack_ffffffffffffffa0,
                                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                         (xmlAttr *)in_stack_ffffffffffffff90);
                      pcVar3 = strdup(pcVar3);
                      (local_8->varinfo).variantsstr = pcVar3;
                    }
                    else {
                      fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for %s\n",in_RSI,
                              (ulong)*(ushort *)(in_RDX + 0x70),*(undefined8 *)(local_40 + 0x10),
                              *(undefined8 *)(in_RDX + 0x10));
                      *(undefined4 *)(in_RDI + 0x80) = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
      for (local_48 = *(long *)(in_RDX + 0x18); local_48 != 0; local_48 = *(long *)(local_48 + 0x30)
          ) {
        if (*(int *)(local_48 + 8) == 1) {
          prVar5 = trydelem(in_RSI,in_RDX,in_stack_ffffffffffffffd8);
          if (prVar5 == (rnndelem *)0x0) {
            iVar1 = trytop((rnndb *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                           in_stack_ffffffffffffffa0,(xmlNode *)in_stack_ffffffffffffff98);
            if ((iVar1 == 0) &&
               (iVar1 = trydoc(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                               (xmlNode *)in_stack_ffffffffffffff88), iVar1 == 0)) {
              fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",in_RSI,
                      (ulong)*(ushort *)(local_48 + 0x70),*(undefined8 *)(in_RDX + 0x10),
                      *(undefined8 *)(local_48 + 0x10));
              *(undefined4 *)(in_RDI + 0x80) = 1;
            }
          }
          else {
            if (local_8->subelemsmax <= local_8->subelemsnum) {
              if (local_8->subelemsmax == 0) {
                local_8->subelemsmax = 0x10;
              }
              else {
                local_8->subelemsmax = local_8->subelemsmax << 1;
              }
              pprVar6 = (rnndelem **)realloc(local_8->subelems,(long)local_8->subelemsmax << 3);
              local_8->subelems = pprVar6;
            }
            iVar1 = local_8->subelemsnum;
            local_8->subelemsnum = iVar1 + 1;
            local_8->subelems[iVar1] = prVar5;
          }
        }
      }
      if ((local_8->type == RNN_ETYPE_ARRAY) && (local_8->stride == 0)) {
        fprintf(_stderr,"%s: Array %s\'s stride is undefined. Aborting.\n",in_RSI,local_8->name);
        exit(-1);
      }
    }
    else {
      iVar1 = strcmp(*(char **)(in_RDX + 0x10),"reg8");
      if (iVar1 == 0) {
        iVar1 = 8;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RDX + 0x10),"reg16");
        if (iVar1 == 0) {
          iVar1 = 0x10;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RDX + 0x10),"reg32");
          if (iVar1 == 0) {
            iVar1 = 0x20;
          }
          else {
            iVar1 = strcmp(*(char **)(in_RDX + 0x10),"reg64");
            if (iVar1 != 0) {
              return (rnndelem *)0x0;
            }
            iVar1 = 0x40;
          }
        }
      }
      local_8 = (rnndelem *)calloc(0x108,1);
      local_8->file = (char *)in_RSI;
      local_8->type = RNN_ETYPE_REG;
      local_8->width = iVar1;
      local_8->length = 1;
      local_8->access = RNN_ACCESS_RW;
      for (p_Var8 = *(_xmlNode **)(in_RDX + 0x58); p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next)
      {
        iVar2 = strcmp((char *)p_Var8->name,"name");
        if (iVar2 == 0) {
          pcVar3 = getattrib((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)local_8,
                             (int)((ulong)p_Var8 >> 0x20),(xmlAttr *)in_stack_ffffffffffffff90);
          pcVar3 = strdup(pcVar3);
          local_8->name = pcVar3;
        }
        else {
          iVar2 = strcmp((char *)p_Var8->name,"offset");
          if (iVar2 == 0) {
            uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                 (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                 (int)((ulong)local_8 >> 0x20),(xmlAttr *)p_Var8);
            local_8->offset = uVar4;
          }
          else {
            iVar2 = strcmp((char *)p_Var8->name,"length");
            if (iVar2 == 0) {
              uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                   (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                   (int)((ulong)local_8 >> 0x20),(xmlAttr *)p_Var8);
              local_8->length = uVar4;
            }
            else {
              iVar2 = strcmp((char *)p_Var8->name,"stride");
              if (iVar2 == 0) {
                uVar4 = getnumattrib(in_stack_ffffffffffffffb0,
                                     (char *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                     (int)((ulong)local_8 >> 0x20),(xmlAttr *)p_Var8);
                local_8->stride = uVar4;
              }
              else {
                iVar2 = strcmp((char *)p_Var8->name,"varset");
                if (iVar2 == 0) {
                  pcVar3 = getattrib((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                     (char *)local_8,(int)((ulong)p_Var8 >> 0x20),
                                     (xmlAttr *)in_stack_ffffffffffffff90);
                  pcVar3 = strdup(pcVar3);
                  (local_8->varinfo).varsetstr = pcVar3;
                }
                else {
                  iVar2 = strcmp((char *)p_Var8->name,"variants");
                  if (iVar2 == 0) {
                    pcVar3 = getattrib((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                       (char *)local_8,(int)((ulong)p_Var8 >> 0x20),
                                       (xmlAttr *)in_stack_ffffffffffffff90);
                    pcVar3 = strdup(pcVar3);
                    (local_8->varinfo).variantsstr = pcVar3;
                  }
                  else {
                    iVar2 = strcmp((char *)p_Var8->name,"access");
                    if (iVar2 == 0) {
                      in_stack_ffffffffffffff90 =
                           (rnntypeinfo *)
                           getattrib((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                     (char *)local_8,(int)((ulong)p_Var8 >> 0x20),
                                     (xmlAttr *)in_stack_ffffffffffffff90);
                      iVar2 = strcmp((char *)in_stack_ffffffffffffff90,"r");
                      if (iVar2 == 0) {
                        local_8->access = RNN_ACCESS_R;
                      }
                      else {
                        iVar2 = strcmp((char *)in_stack_ffffffffffffff90,"w");
                        if (iVar2 == 0) {
                          local_8->access = RNN_ACCESS_W;
                        }
                        else {
                          iVar2 = strcmp((char *)in_stack_ffffffffffffff90,"rw");
                          if (iVar2 == 0) {
                            local_8->access = RNN_ACCESS_RW;
                          }
                          else {
                            fprintf(_stderr,"%s:%d: wrong access type \"%s\" for register\n",in_RSI,
                                    (ulong)*(ushort *)(in_RDX + 0x70),in_stack_ffffffffffffff90);
                          }
                        }
                      }
                    }
                    else {
                      iVar2 = trytypeattr((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),
                                          (char *)local_8,p_Var8,
                                          (xmlAttr *)in_stack_ffffffffffffff90,
                                          in_stack_ffffffffffffff88);
                      if (iVar2 == 0) {
                        fprintf(_stderr,"%s:%d: wrong attribute \"%s\" for register\n",in_RSI,
                                (ulong)*(ushort *)(in_RDX + 0x70),p_Var8->name);
                        *(undefined4 *)(in_RDI + 0x80) = 1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      db_00 = (rnndb *)0x0;
      for (p_Var8 = *(_xmlNode **)(in_RDX + 0x18); p_Var8 != (_xmlNode *)0x0; p_Var8 = p_Var8->next)
      {
        if ((((p_Var8->type == XML_ELEMENT_NODE) &&
             (iVar2 = trytypetag((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)local_8,
                                 (xmlNode *)db_00,in_stack_ffffffffffffff90), iVar2 == 0)) &&
            (iVar2 = trytop((rnndb *)CONCAT44(iVar1,in_stack_ffffffffffffffa8),(char *)local_8,
                            (xmlNode *)db_00), iVar2 == 0)) &&
           (iVar2 = trydoc(db_00,(char *)in_stack_ffffffffffffff90,p_Var8), iVar2 == 0)) {
          fprintf(_stderr,"%s:%d: wrong tag in %s: <%s>\n",in_RSI,(ulong)p_Var8->line,
                  *(undefined8 *)(in_RDX + 0x10),p_Var8->name);
          *(undefined4 *)(in_RDI + 0x80) = 1;
        }
      }
      if (local_8->name == (char *)0x0) {
        fprintf(_stderr,"%s:%d: nameless register\n",in_RSI,(ulong)*(ushort *)(in_RDX + 0x70));
        *(undefined4 *)(in_RDI + 0x80) = 1;
        local_8 = (rnndelem *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static struct rnndelem *trydelem(struct rnndb *db, char *file, xmlNode *node) {
	if (!strcmp(node->name, "use-group")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->file = file;
		res->type = RNN_ETYPE_USE_GROUP;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		if (!res->name) {
			fprintf (stderr, "%s:%d: nameless use-group\n", file, node->line);
			db->estatus = 1;
			return 0;
		}
		return res;
	} else if (!strcmp(node->name, "stripe") || !strcmp(node->name, "array")) {
		struct rnndelem *res = calloc(sizeof *res, 1);
		res->type = (strcmp(node->name, "stripe")?RNN_ETYPE_ARRAY:RNN_ETYPE_STRIPE);
		res->length = 1;
		res->file = file;
		xmlAttr *attr = node->properties;
		while (attr) {
			if (!strcmp(attr->name, "name")) {
				res->name = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "offset")) {
				res->offset = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "length")) {
				res->length = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "stride")) {
				res->stride = getnumattrib(db, file, node->line, attr);
			} else if (!strcmp(attr->name, "prefix")) {
				res->varinfo.prefixstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "varset")) {
				res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
			} else if (!strcmp(attr->name, "variants")) {
				res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
			} else {
				fprintf (stderr, "%s:%d: wrong attribute \"%s\" for %s\n", file, node->line, attr->name, node->name);
				db->estatus = 1;
			}
			attr = attr->next;
		}
		xmlNode *chain = node->children;
		while (chain) {
			struct rnndelem *delem;
			if (chain->type != XML_ELEMENT_NODE) {
			} else if ((delem = trydelem(db, file, chain))) {
				ADDARRAY(res->subelems, delem);
			} else if (!trytop(db, file, chain) && !trydoc(db, file, chain)) {
				fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
				db->estatus = 1;
			}
			chain = chain->next;
		}

		/* Sanity checking */
		if (res->type == RNN_ETYPE_ARRAY && res->stride == 0) {
			fprintf(stderr, "%s: Array %s's stride is undefined. Aborting.\n", file, res->name);
			exit(-1);
		}
		return res;

	}
	int width;
	if (!strcmp(node->name, "reg8"))
		width = 8;
	else if (!strcmp(node->name, "reg16"))
		width = 16;
	else if (!strcmp(node->name, "reg32"))
		width = 32;
	else if (!strcmp(node->name, "reg64"))
		width = 64;
	else
		return 0;
	struct rnndelem *res = calloc(sizeof *res, 1);
	res->file = file;
	res->type = RNN_ETYPE_REG;
	res->width = width;
	res->length = 1;
	res->access = RNN_ACCESS_RW;
	xmlAttr *attr = node->properties;
	while (attr) {
		if (!strcmp(attr->name, "name")) {
			res->name = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "offset")) {
			res->offset = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "length")) {
			res->length = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "stride")) {
			res->stride = getnumattrib(db, file, node->line, attr);
		} else if (!strcmp(attr->name, "varset")) {
			res->varinfo.varsetstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "variants")) {
			res->varinfo.variantsstr = strdup(getattrib(db, file, node->line, attr));
		} else if (!strcmp(attr->name, "access")) {
			char *str = getattrib(db, file, node->line, attr);
			if (!strcmp(str, "r"))
				res->access = RNN_ACCESS_R;
			else if (!strcmp(str, "w"))
				res->access = RNN_ACCESS_W;
			else if (!strcmp(str, "rw"))
				res->access = RNN_ACCESS_RW;
			else
				fprintf (stderr, "%s:%d: wrong access type \"%s\" for register\n", file, node->line, str);
		} else if (!trytypeattr(db, file, node, attr, &res->typeinfo)) {
			fprintf (stderr, "%s:%d: wrong attribute \"%s\" for register\n", file, node->line, attr->name);
			db->estatus = 1;
		}
		attr = attr->next;
	}
	xmlNode *chain = node->children;
	while (chain) {
		if (chain->type != XML_ELEMENT_NODE) {
		} else if (!trytypetag(db, file, chain, &res->typeinfo) && !trytop(db, file, chain) && !trydoc(db, file, chain)) {
			fprintf (stderr, "%s:%d: wrong tag in %s: <%s>\n", file, chain->line, node->name, chain->name);
			db->estatus = 1;
		}
		chain = chain->next;
	}
	if (!res->name) {
		fprintf (stderr, "%s:%d: nameless register\n", file, node->line);
		db->estatus = 1;
		return 0;
	} else {
	}
	return res;
}